

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int formatf(void *userp,_func_int_uchar_void_ptr *stream,char *format,__va_list_tag *ap_save)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  size_t sVar7;
  byte bVar8;
  int *piVar9;
  double dVar10;
  uint *puVar11;
  double *pdVar12;
  char *__s;
  long lVar13;
  double dVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  int unaff_EBP;
  uint uVar18;
  uint uVar19;
  long lVar20;
  double dVar21;
  size_t maxlength;
  byte *pbVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  byte *pbVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  uchar *puVar32;
  byte *pbVar33;
  bool bVar34;
  char *fmt;
  curl_off_t num;
  char work [328];
  va_input input [128];
  outsegment output [128];
  int local_1a04;
  byte *local_1a00;
  ulong local_19f8;
  char *local_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  uint local_19a4;
  uint local_19a0 [2];
  ulong local_1998;
  byte *local_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  uint local_1838 [2];
  double local_1830 [255];
  uint local_1038 [2];
  undefined8 local_1030;
  long local_1028 [511];
  
  local_1988 = 0;
  uStack_1980 = 0;
  uVar30 = 0xffffffff;
  uVar23 = 0;
  local_1a04 = 0;
  uVar29 = 0;
  local_19c8 = (byte *)format;
  do {
    pbVar33 = local_19c8;
    lVar13 = 0;
    while( true ) {
      if (pbVar33[lVar13] == 0) {
        if (pbVar33 + lVar13 != (byte *)format) {
          if (0x7f < (int)uVar23) {
            unaff_EBP = 0xb;
            goto LAB_00145310;
          }
          lVar20 = (long)(int)uVar23;
          uVar23 = uVar23 + 1;
          (&local_1030)[lVar20 * 4] = 0x100000;
          local_1028[lVar20 * 4] = (long)format;
          local_1028[lVar20 * 4 + 1] = (long)(pbVar33 + (lVar13 - (long)format));
        }
        if ((int)uVar30 < 0) goto LAB_0014546c;
        pdVar6 = local_1830;
        uVar29 = 0;
        goto LAB_00145361;
      }
      local_19c8 = pbVar33 + lVar13 + 1;
      if (pbVar33[lVar13] == 0x25) break;
      lVar13 = lVar13 + 1;
    }
    pbVar26 = pbVar33 + (lVar13 - (long)format);
    pbVar22 = (byte *)format;
    if (pbVar33[lVar13 + 1] == 0x25) {
      if (pbVar26 == (byte *)0x0) {
LAB_00144f65:
        format = (char *)local_19c8;
        local_19c8 = pbVar33 + lVar13 + 2;
LAB_00144f71:
        bVar34 = false;
        pbVar22 = (byte *)format;
      }
      else {
        if ((int)uVar23 < 0x80) {
          lVar20 = (long)(int)uVar23;
          (&local_1030)[lVar20 * 4] = 0x100000;
          local_1028[lVar20 * 4] = (long)format;
          local_1028[lVar20 * 4 + 1] = (long)pbVar26;
          uVar23 = uVar23 + 1;
          goto LAB_00144f65;
        }
        unaff_EBP = 0xb;
        bVar34 = true;
        uVar23 = uVar23 + 1;
      }
      goto LAB_0014529b;
    }
    local_19a4 = 0xffffffff;
    local_19f8 = 0;
    local_1990 = pbVar26;
    local_1a00 = (byte *)format;
    if (local_1a04 == 1) {
LAB_00144c97:
      local_1a04 = 1;
      bVar34 = false;
    }
    else {
      uVar15 = dollarstring((char *)local_19c8,(char **)&local_19c8);
      if ((int)uVar15 < 0) {
        if (local_1a04 == 2) {
          local_1a04 = 2;
          unaff_EBP = 1;
LAB_00145296:
          bVar34 = true;
          goto LAB_0014529b;
        }
        goto LAB_00144c97;
      }
      local_1a04 = 2;
      bVar34 = true;
      local_19a4 = uVar15;
    }
    bVar31 = true;
    uVar27 = 0;
    uVar15 = 0;
    do {
      pbVar33 = local_19c8 + 1;
      bVar1 = *local_19c8;
      if (0x4b < bVar1) {
        if (bVar1 < 0x6c) {
          if (bVar1 == 0x4c) {
            uVar15 = uVar15 | 0x80;
            local_19c8 = pbVar33;
          }
          else {
            if (bVar1 == 0x4f) goto LAB_00144e51;
            if (bVar1 != 0x68) goto switchD_00144d05_caseD_21;
            uVar15 = uVar15 | 0x10;
            local_19c8 = pbVar33;
          }
        }
        else {
          if (bVar1 == 0x6c) {
            if ((uVar15 & 0x20) != 0) goto LAB_00144e56;
          }
          else {
            if (bVar1 == 0x71) {
LAB_00144e56:
              uVar15 = uVar15 | 0x40;
              local_19c8 = pbVar33;
              goto LAB_00144ecc;
            }
            if (bVar1 != 0x7a) goto switchD_00144d05_caseD_21;
          }
LAB_00144e51:
          uVar15 = uVar15 | 0x20;
          local_19c8 = pbVar33;
        }
        goto LAB_00144ecc;
      }
      switch(bVar1) {
      case 0x20:
        uVar15 = uVar15 | 1;
        local_19c8 = pbVar33;
        break;
      default:
switchD_00144d05_caseD_21:
        bVar31 = false;
        break;
      case 0x23:
        uVar15 = uVar15 | 8;
        local_19c8 = pbVar33;
        break;
      case 0x2a:
        uVar15 = uVar15 | 0x4000;
        uVar27 = 0xffffffff;
        local_19c8 = pbVar33;
        if (bVar34) {
          uVar16 = dollarstring((char *)pbVar33,(char **)&local_19c8);
          uVar27 = (ulong)uVar16;
          if ((int)uVar16 < 0) {
            local_1a04 = 2;
            unaff_EBP = 2;
            goto LAB_00145296;
          }
        }
        break;
      case 0x2b:
        uVar15 = uVar15 | 2;
        local_19c8 = pbVar33;
        break;
      case 0x2d:
        uVar15 = uVar15 & 0xfffffefb | 4;
        local_19c8 = pbVar33;
        break;
      case 0x2e:
        if (*pbVar33 == 0x2a) {
          uVar15 = uVar15 | 0x10000;
          local_19c8 = local_19c8 + 2;
          local_19f8 = 0xffffffff;
          if (bVar34) {
            uVar16 = dollarstring((char *)local_19c8,(char **)&local_19c8);
            local_19f8 = (ulong)uVar16;
            if ((int)uVar16 < 0) {
              unaff_EBP = 3;
              local_1a04 = 2;
              goto LAB_00145296;
            }
          }
        }
        else {
          bVar1 = *pbVar33;
          if (bVar1 == 0x2d) {
            pbVar33 = local_19c8 + 2;
          }
          local_19c8 = pbVar33;
          local_1998 = uVar30;
          iVar3 = Curl_str_number((char **)&local_19c8,(curl_off_t *)local_19a0,0x7fffffff);
          uVar16 = -local_19a0[0];
          if (bVar1 != 0x2d) {
            uVar16 = local_19a0[0];
          }
          local_19f8 = (ulong)uVar16;
          uVar30 = local_1998;
          if (iVar3 != 0) {
            unaff_EBP = 5;
            goto LAB_00145296;
          }
          uVar15 = uVar15 | 0x8000;
        }
        if ((~uVar15 & 0x18000) == 0) {
          unaff_EBP = 6;
          goto LAB_00145296;
        }
        break;
      case 0x30:
        uVar15 = uVar15 | (~uVar15 & 4) << 6;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        iVar3 = Curl_str_number((char **)&local_19c8,(curl_off_t *)local_19a0,0x7fffffff);
        if (iVar3 != 0) {
          unaff_EBP = 7;
          goto LAB_00145296;
        }
        uVar27 = (ulong)local_19a0[0];
        uVar15 = uVar15 | 0x2000;
      }
LAB_00144ecc:
      uVar16 = (uint)uVar27;
    } while (bVar31);
    bVar1 = *local_19c8;
    uVar18 = 0;
    if (bVar1 < 0x58) {
      if (bVar1 == 0x45) {
        uVar15 = uVar15 | 0x41000;
      }
      else {
        if (bVar1 != 0x47) {
          if (bVar1 != 0x53) goto switchD_00144f18_caseD_68;
          uVar15 = uVar15 | 8;
          goto switchD_00144f18_caseD_73;
        }
        uVar15 = uVar15 | 0x81000;
      }
      goto switchD_00144f18_caseD_66;
    }
    uVar19 = 8;
    uVar18 = 0;
    switch(bVar1) {
    case 99:
      uVar15 = uVar15 | 0x20000;
      uVar18 = 3;
      break;
    case 100:
    case 0x69:
      uVar18 = 5;
      if ((uVar15 & 0x40) == 0) {
        uVar18 = 4 - ((uVar15 & 0x20) == 0);
      }
      break;
    case 0x65:
      uVar15 = uVar15 | 0x40000;
    case 0x66:
switchD_00144f18_caseD_66:
      uVar18 = 9;
      break;
    case 0x67:
      uVar15 = uVar15 | 0x80000;
      goto switchD_00144f18_caseD_66;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_00144f18_caseD_68:
      goto LAB_00144f71;
    case 0x6e:
      uVar18 = 2;
      break;
    case 0x6f:
      uVar18 = 7 - ((uVar15 & 0x20) == 0);
      if ((uVar15 & 0x40) != 0) {
        uVar18 = uVar19;
      }
      uVar15 = uVar15 | 0x600;
      break;
    case 0x70:
      uVar18 = 1;
      break;
    case 0x73:
      break;
    case 0x75:
      uVar18 = 7 - ((uVar15 & 0x20) == 0);
      if ((uVar15 & 0x40) != 0) {
        uVar18 = uVar19;
      }
      uVar15 = uVar15 | 0x200;
      break;
    case 0x78:
      uVar18 = 7 - ((uVar15 & 0x20) == 0);
      if ((uVar15 & 0x40) != 0) {
        uVar18 = uVar19;
      }
      uVar15 = uVar15 | 0xa00;
      break;
    default:
      if (bVar1 != 0x58) goto switchD_00144f18_caseD_68;
      uVar18 = 7 - ((uVar15 & 0x20) == 0);
      if ((uVar15 & 0x40) != 0) {
        uVar18 = uVar19;
      }
      uVar15 = uVar15 | 0x1a00;
    }
switchD_00144f18_caseD_73:
    uVar19 = (uint)local_19f8;
    uVar25 = uVar29;
    if ((uVar15 >> 0xe & 1) == 0) {
LAB_001450e9:
      uVar29 = uVar25;
      if ((uVar15 >> 0x10 & 1) != 0) {
        if ((int)uVar19 < 0) {
          uVar29 = (ulong)((int)uVar25 + 1);
          local_19f8 = uVar25;
        }
        else if ((*(byte *)((long)&local_1988 + (local_19f8 >> 3)) >> (uVar19 & 7) & 1) != 0) {
          unaff_EBP = 10;
          goto LAB_00145188;
        }
        uVar19 = (uint)local_19f8;
        if (0x7f < (int)uVar19) goto LAB_00145183;
        if ((int)uVar30 < (int)uVar19) {
          uVar30 = local_19f8;
        }
        uVar30 = uVar30 & 0xffffffff;
        local_1838[(long)(int)uVar19 * 4] = 0xc;
        uVar24 = uVar19 + 7;
        if (-1 < (int)uVar19) {
          uVar24 = uVar19;
        }
        pbVar33 = (byte *)((long)&local_1988 + (long)((int)uVar24 >> 3));
        *pbVar33 = *pbVar33 | (byte)(1 << ((byte)local_19f8 & 7));
      }
      uVar27 = (ulong)local_19a4;
      if ((int)local_19a4 < 0) {
        uVar27 = uVar29;
      }
      uVar29 = (ulong)(uint)((int)uVar29 - ((int)local_19a4 >> 0x1f));
      iVar3 = (int)uVar27;
      if (0x7f < iVar3) {
LAB_00145183:
        unaff_EBP = 4;
        goto LAB_00145188;
      }
      iVar4 = (int)uVar30;
      uVar30 = uVar30 & 0xffffffff;
      if (iVar4 < iVar3) {
        uVar30 = uVar27;
      }
      local_1838[(long)iVar3 * 4] = uVar18;
      iVar4 = iVar3 + 7;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      pbVar33 = (byte *)((long)&local_1988 + (long)(iVar4 >> 3));
      *pbVar33 = *pbVar33 | (byte)(1 << ((byte)uVar27 & 7));
      local_19c8 = local_19c8 + 1;
      if ((int)uVar23 < 0x80) {
        lVar13 = (long)(int)uVar23;
        *(int *)((long)local_1028 + lVar13 * 0x20 + -4) = iVar3;
        *(uint *)(&local_1030 + lVar13 * 4) = uVar15;
        local_1038[lVar13 * 8] = uVar16;
        local_1038[lVar13 * 8 + 1] = uVar19;
        local_1028[lVar13 * 4] = (long)format;
        local_1028[lVar13 * 4 + 1] = (long)local_1990;
        bVar34 = false;
        pbVar22 = local_19c8;
        uVar23 = uVar23 + 1;
      }
      else {
        bVar34 = true;
        unaff_EBP = 0xb;
        uVar23 = uVar23 + 1;
      }
    }
    else {
      if ((int)uVar16 < 0) {
        uVar25 = (ulong)((int)uVar29 + 1);
        uVar27 = uVar29;
LAB_001450a0:
        uVar29 = uVar25;
        uVar16 = (uint)uVar27;
        if ((int)uVar16 < 0x80) {
          iVar3 = (int)uVar30;
          uVar30 = uVar30 & 0xffffffff;
          if (iVar3 < (int)uVar16) {
            uVar30 = uVar27;
          }
          local_1838[(long)(int)uVar16 * 4] = 0xb;
          uVar24 = uVar16 + 7;
          if (-1 < (int)uVar16) {
            uVar24 = uVar16;
          }
          pbVar33 = (byte *)((long)&local_1988 + (long)((int)uVar24 >> 3));
          *pbVar33 = *pbVar33 | (byte)(1 << ((byte)uVar27 & 7));
          uVar25 = uVar29;
          goto LAB_001450e9;
        }
        goto LAB_00145183;
      }
      if ((*(byte *)((long)&local_1988 + (uVar27 >> 3)) >> (uVar16 & 7) & 1) == 0)
      goto LAB_001450a0;
      unaff_EBP = 9;
LAB_00145188:
      bVar34 = true;
    }
LAB_0014529b:
    format = (char *)pbVar22;
  } while (!bVar34);
LAB_00145310:
  uVar23 = 0;
  goto LAB_0014546e;
  while( true ) {
    uVar29 = uVar29 + 1;
    pdVar6 = pdVar6 + 2;
    if ((int)uVar30 + 1 == uVar29) break;
LAB_00145361:
    uVar15 = 1 << ((byte)uVar29 & 7) &
             (uint)*(byte *)((long)&local_1988 + (uVar29 >> 3 & 0x1fffffff));
    if (uVar15 == 0) {
      unaff_EBP = 8;
      goto switchD_00145394_caseD_a;
    }
    switch(*(undefined4 *)(pdVar6 + -1)) {
    case 0:
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      uVar16 = ap_save->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        pdVar12 = (double *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        pdVar12 = (double *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = pdVar12 + 1;
      }
      dVar10 = *pdVar12;
      break;
    case 3:
    case 0xb:
    case 0xc:
      uVar16 = ap_save->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        piVar9 = (int *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        piVar9 = (int *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = piVar9 + 2;
      }
      dVar10 = (double)(long)*piVar9;
      break;
    case 6:
      uVar16 = ap_save->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        puVar11 = (uint *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        puVar11 = (uint *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = puVar11 + 2;
      }
      dVar10 = (double)(ulong)*puVar11;
      break;
    case 9:
      uVar16 = ap_save->fp_offset;
      if ((ulong)uVar16 < 0xa1) {
        pdVar12 = (double *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->fp_offset = uVar16 + 0x10;
      }
      else {
        pdVar12 = (double *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = pdVar12 + 1;
      }
      *pdVar6 = *pdVar12;
    default:
      goto switchD_00145394_caseD_a;
    }
    *pdVar6 = dVar10;
switchD_00145394_caseD_a:
    if (uVar15 == 0) goto LAB_00145310;
  }
LAB_0014546c:
  unaff_EBP = 0;
LAB_0014546e:
  if ((unaff_EBP != 0) || ((int)uVar23 < 1)) {
    return 0;
  }
  uVar30 = 0;
  local_19d0 = "0123456789abcdefghijklmnopqrstuvwxyz";
  uVar15 = 0;
LAB_0014549b:
  lVar13 = local_1028[uVar30 * 4 + 1];
  uVar16 = *(uint *)(&local_1030 + uVar30 * 4);
  if (lVar13 != 0) {
    lVar20 = local_1028[uVar30 * 4];
    lVar28 = 0;
    do {
      iVar3 = (int)lVar28;
      if (*(uchar *)(lVar20 + lVar28) == '\0') break;
      iVar3 = (*stream)(*(uchar *)(lVar20 + lVar28),userp);
      if (iVar3 != 0) {
        uVar15 = uVar15 + (int)lVar28;
        lVar13 = 1;
        bVar34 = false;
        local_1a00 = (byte *)(ulong)uVar15;
        goto LAB_00145520;
      }
      lVar28 = lVar28 + 1;
      iVar3 = (int)lVar13;
    } while (lVar13 != lVar28);
    uVar15 = iVar3 + uVar15;
    bVar34 = (uVar16 & 0x100000) == 0;
    lVar13 = 0;
LAB_00145520:
    if (bVar34) goto LAB_0014552c;
    goto LAB_00145f2e;
  }
LAB_0014552c:
  uVar18 = local_1038[uVar30 * 8];
  uVar29 = (ulong)uVar18;
  if ((uVar16 >> 0xe & 1) != 0) {
    uVar18 = *(uint *)(local_1830 + (long)(int)uVar18 * 2);
    uVar29 = (ulong)uVar18;
    if ((int)uVar18 < 0) {
      uVar29 = (ulong)-uVar18;
      uVar16 = uVar16 & 0xfffffefb | 4;
    }
  }
  iVar3 = (int)uVar29;
  if ((uVar16 >> 0x10 & 1) == 0) {
    uVar18 = 0xffffffff;
    if ((short)uVar16 < 0) {
      uVar18 = local_1038[uVar30 * 8 + 1];
    }
  }
  else {
    uVar18 = *(uint *)(local_1830 + (long)(int)local_1038[uVar30 * 8 + 1] * 2);
    if ((int)uVar18 < 0) {
      uVar18 = 0xffffffff;
    }
  }
  uVar27 = (ulong)*(uint *)((long)local_1028 + uVar30 * 0x20 + -4);
  uVar19 = uVar15;
  if (9 < local_1838[uVar27 * 4]) goto LAB_00145f2c;
  uVar24 = uVar16 & 8;
  switch(local_1838[uVar27 * 4]) {
  case 0:
    __s = (char *)local_1830[uVar27 * 2];
    if (__s == (char *)0x0) {
      if (uVar18 == 0xffffffff || 4 < (int)uVar18) {
        uVar16 = uVar16 & 0xfffffff7;
        sVar7 = 5;
        __s = "(nil)";
      }
      else {
        __s = "";
LAB_00145c21:
        sVar7 = 0;
      }
    }
    else if (uVar18 == 0xffffffff) {
      if (*__s == '\0') goto LAB_00145c21;
      sVar7 = strlen(__s);
    }
    else {
      sVar7 = (size_t)(int)uVar18;
    }
    uVar29 = 0x7fffffff;
    if (sVar7 < 0x7fffffff) {
      uVar29 = sVar7;
    }
    if ((uVar16 & 8) == 0) {
LAB_00145c5a:
      iVar4 = iVar3 - (int)uVar29;
      if ((uVar16 & 4) == 0) {
        if (iVar4 < 1) {
          iVar4 = iVar4 + -1;
        }
        else {
          iVar3 = iVar3 + uVar15;
          do {
            iVar5 = (*stream)(' ',userp);
            if (iVar5 != 0) goto LAB_00145db8;
            uVar15 = uVar15 + 1;
            iVar5 = iVar4 + -1;
            bVar34 = 0 < iVar4;
            iVar4 = iVar5;
          } while (iVar5 != 0 && bVar34);
          iVar4 = -1;
          uVar15 = iVar3 - (int)uVar29;
        }
      }
      uVar18 = uVar15;
      if (sVar7 != 0) {
        uVar18 = uVar15 + (int)sVar7;
        uVar29 = 0;
        do {
          if (__s[uVar29] == '\0') {
            uVar18 = uVar15 + (int)uVar29;
            break;
          }
          iVar3 = (*stream)(__s[uVar29],userp);
          if (iVar3 != 0) {
            uVar15 = uVar15 + (int)uVar29;
            goto LAB_00145db8;
          }
          uVar29 = uVar29 + 1;
        } while (sVar7 != uVar29);
      }
      uVar15 = uVar18;
      if (((uVar16 & 4) != 0) && (0 < iVar4)) {
        iVar3 = iVar4 + 1;
        uVar19 = uVar18;
        do {
          uVar15 = uVar19;
          iVar5 = (*stream)(' ',userp);
          if (iVar5 != 0) goto LAB_00145db8;
          uVar19 = uVar15 + 1;
          iVar3 = iVar3 + -1;
          uVar15 = iVar4 + uVar18;
        } while (1 < iVar3);
      }
      lVar13 = 10;
      bVar34 = true;
      if ((uVar16 & 8) != 0) {
        iVar3 = (*stream)('\"',userp);
        if (iVar3 != 0) goto LAB_00145db8;
        uVar15 = uVar15 + 1;
      }
    }
    else {
      iVar4 = (*stream)('\"',userp);
      if (iVar4 == 0) {
        uVar15 = uVar15 + 1;
        goto LAB_00145c5a;
      }
LAB_00145db8:
      lVar13 = 1;
      bVar34 = false;
      local_1a00 = (byte *)(ulong)uVar15;
    }
    break;
  case 1:
    dVar10 = local_1830[uVar27 * 2];
    if (dVar10 == 0.0) {
      if ((uVar16 & 4) == 0) {
        iVar3 = iVar3 + -5;
      }
      else if (iVar3 < 6) {
        iVar3 = iVar3 + -6;
      }
      else {
        iVar5 = iVar3 + -5;
        iVar4 = iVar3 + uVar15;
        do {
          iVar3 = (*stream)(' ',userp);
          if (iVar3 != 0) goto LAB_00145f0e;
          uVar15 = uVar15 + 1;
          iVar5 = iVar5 + -1;
        } while (0 < iVar5);
        iVar3 = -1;
        uVar15 = iVar4 - 5;
      }
      uVar18 = uVar15 + 5;
      uVar2 = '(';
      lVar13 = 0;
LAB_00145eb3:
      iVar4 = (*stream)(uVar2,userp);
      if (iVar4 == 0) goto code_r0x00145ec3;
      uVar15 = uVar15 + (int)lVar13;
LAB_00145f0e:
      bVar34 = false;
      local_1a00 = (byte *)(ulong)uVar15;
      uVar19 = uVar15;
      goto LAB_00145f23;
    }
    local_19d0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    if ((uVar16 >> 0xc & 1) == 0) {
      local_19d0 = "0123456789abcdefghijklmnopqrstuvwxyz";
    }
    dVar21 = 7.90505033345994e-323;
    bVar1 = 1;
    bVar17 = 0;
    bVar34 = false;
    bVar8 = 0;
    local_1a04._0_1_ = 1;
    goto LAB_00145870;
  case 2:
    if (((uVar16 & 0x40) == 0) && ((uVar16 & 0x20) == 0)) {
      if ((uVar16 & 0x10) == 0) {
        *(uint *)local_1830[uVar27 * 2] = uVar15;
      }
      else {
        *(short *)local_1830[uVar27 * 2] = (short)uVar15;
      }
    }
    else {
      *(long *)local_1830[uVar27 * 2] = (long)(int)uVar15;
    }
    goto LAB_00145f2c;
  default:
    goto switchD_001455ca_caseD_3;
  case 6:
  case 7:
  case 8:
    uVar16 = uVar16 | 0x200;
switchD_001455ca_caseD_3:
    dVar10 = local_1830[uVar27 * 2];
    if ((uVar16 >> 0x11 & 1) == 0) {
      bVar1 = (byte)(uVar24 >> 3);
      if ((uVar16 >> 10 & 1) == 0) {
        if ((uVar16 >> 0xb & 1) == 0) {
          dVar21 = 4.94065645841247e-323;
          bVar34 = true;
          if ((uVar16 >> 9 & 1) != 0) {
            bVar8 = 0;
            bVar34 = true;
            goto LAB_00145684;
          }
          dVar14 = (double)-(long)dVar10;
          if (0 < (long)dVar10) {
            dVar14 = dVar10;
          }
          bVar17 = (byte)((ulong)dVar10 >> 0x3f);
          bVar8 = 0;
          local_1a04._0_1_ = 0;
          dVar10 = dVar14;
        }
        else {
          local_19d0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
          if ((uVar16 >> 0xc & 1) == 0) {
            local_19d0 = "0123456789abcdefghijklmnopqrstuvwxyz";
          }
          dVar21 = 7.90505033345994e-323;
          local_1a04._0_1_ = 1;
          bVar17 = 0;
          bVar34 = false;
          bVar8 = 0;
        }
      }
      else {
        dVar21 = 3.95252516672997e-323;
        bVar8 = 1;
        bVar34 = false;
LAB_00145684:
        bVar17 = 0;
        local_1a04._0_1_ = 0;
      }
LAB_00145870:
      if (uVar18 == 0xffffffff) {
        uVar18 = 1;
      }
      if (bVar34) {
        if (dVar10 == 0.0) {
LAB_001458f2:
          uVar29 = 0x144;
        }
        else {
          uVar29 = 0x144;
          do {
            *(byte *)((long)&local_1988 + uVar29) =
                 SUB81(dVar10,0) + (char)((ulong)dVar10 / 10) * -10 | 0x30;
            uVar29 = uVar29 - 1;
            bVar34 = 9 < (ulong)dVar10;
            dVar10 = (double)((ulong)dVar10 / 10);
          } while (bVar34);
        }
      }
      else {
        if (dVar10 == 0.0) goto LAB_001458f2;
        uVar29 = 0x144;
        do {
          *(char *)((long)&local_1988 + uVar29) = local_19d0[(ulong)dVar10 % (ulong)dVar21];
          uVar29 = uVar29 - 1;
          bVar34 = (ulong)dVar21 <= (ulong)dVar10;
          dVar10 = (double)((ulong)dVar10 / (ulong)dVar21);
        } while (bVar34);
      }
      iVar5 = (int)uVar29;
      iVar4 = 0x144 - iVar5;
      iVar3 = iVar3 - iVar4;
      iVar4 = uVar18 - iVar4;
      if (((bVar8 & bVar1) == 1) && (iVar4 < 1)) {
        *(undefined1 *)((long)&local_1988 + uVar29) = 0x30;
        uVar29 = uVar29 - 1;
        iVar3 = iVar3 + -1;
      }
      if ((0 < iVar4) && (iVar3 = iVar3 - iVar4, -1 < (long)uVar29)) {
        uVar27 = (ulong)((uVar18 + iVar5) - 0x145);
        if (uVar29 < uVar27) {
          uVar27 = uVar29;
        }
        memset((void *)((long)&local_1988 + (uVar29 - uVar27)),0x30,uVar27 + 1);
        uVar29 = uVar29 + ~uVar27;
      }
      iVar4 = iVar3 + -2;
      if (((byte)local_1a04 & bVar1) == 0) {
        iVar4 = iVar3;
      }
      uVar18 = (uint)((uVar16 & 3) != 0 | bVar17);
      iVar3 = iVar4 - uVar18;
      if ((uVar16 & 0x104) == 0) {
        if (iVar3 < 1) {
          iVar3 = iVar3 + -1;
        }
        else {
          iVar4 = iVar4 + uVar15;
          do {
            iVar5 = (*stream)(' ',userp);
            if (iVar5 != 0) goto LAB_00145e95;
            uVar15 = uVar15 + 1;
            iVar5 = iVar3 + -1;
            bVar34 = 0 < iVar3;
            iVar3 = iVar5;
          } while (iVar5 != 0 && bVar34);
          iVar3 = -1;
          uVar15 = iVar4 - uVar18;
        }
      }
      if (bVar17 == 0) {
        if ((uVar16 & 2) != 0) {
          uVar2 = '+';
          goto LAB_00145a06;
        }
        if ((uVar16 & 1) != 0) {
          uVar2 = ' ';
          goto LAB_00145a06;
        }
      }
      else {
        uVar2 = '-';
LAB_00145a06:
        iVar4 = (*stream)(uVar2,userp);
        if (iVar4 != 0) goto LAB_00145e95;
        uVar15 = uVar15 + 1;
      }
      if (((byte)local_1a04 & bVar1) != 0) {
        iVar4 = (*stream)('0',userp);
        lVar13 = 1;
        if (iVar4 != 0) goto LAB_00145e95;
        if ((uVar16 >> 0xc & 1) == 0) {
          uVar2 = 'x';
        }
        else {
          uVar2 = 'X';
        }
        iVar4 = (*stream)(uVar2,userp);
        if (iVar4 != 0) {
          local_1a00 = (byte *)(ulong)(uVar15 + 1);
          uVar15 = uVar15 + 1;
          goto LAB_00145f2e;
        }
        uVar15 = uVar15 + 2;
      }
      if ((uVar16 & 0x104) == 0x100) {
        if (iVar3 < 1) {
          iVar3 = iVar3 + -1;
        }
        else {
          uVar18 = iVar3 + uVar15;
          do {
            iVar4 = (*stream)('0',userp);
            if (iVar4 != 0) goto LAB_00145e95;
            uVar15 = uVar15 + 1;
            iVar4 = iVar3 + -1;
            bVar34 = 0 < iVar3;
            iVar3 = iVar4;
          } while (iVar4 != 0 && bVar34);
          iVar3 = -1;
          uVar15 = uVar18;
        }
      }
      uVar18 = uVar15;
      if ((long)uVar29 < 0x144) {
        uVar18 = (uVar15 - (int)uVar29) + 0x144;
        do {
          iVar4 = (*stream)(*(uchar *)((long)&local_1988 + uVar29 + 1),userp);
          if (iVar4 != 0) goto LAB_00145e95;
          uVar29 = uVar29 + 1;
          uVar15 = uVar15 + 1;
        } while (uVar29 != 0x144);
      }
      uVar19 = uVar18;
      if (((uVar16 & 4) != 0) && (0 < iVar3)) {
        uVar19 = iVar3 + uVar18;
        iVar3 = iVar3 + 1;
        uVar15 = uVar18;
        do {
          iVar4 = (*stream)(' ',userp);
          if (iVar4 != 0) goto LAB_00145e95;
          uVar15 = uVar15 + 1;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
      goto LAB_00145f2c;
    }
    if ((uVar16 & 4) == 0) {
      if (iVar3 < 2) {
        iVar3 = iVar3 + -1;
      }
      else {
        iVar4 = iVar3 + uVar15;
        do {
          iVar3 = (*stream)(' ',userp);
          if (iVar3 != 0) goto LAB_00145e95;
          uVar15 = uVar15 + 1;
          uVar18 = (int)uVar29 - 1;
          uVar29 = (ulong)uVar18;
        } while (1 < (int)uVar18);
        iVar3 = 0;
        uVar15 = iVar4 - 1;
      }
    }
    iVar4 = (*stream)(SUB81(dVar10,0),userp);
    lVar13 = 1;
    if (iVar4 == 0) {
      uVar18 = uVar15 + 1;
      uVar19 = uVar18;
      if (((uVar16 & 4) != 0) && (1 < iVar3)) {
        uVar19 = uVar15 + iVar3;
        iVar3 = iVar3 + 1;
        do {
          iVar4 = (*stream)(' ',userp);
          if (iVar4 != 0) {
            local_1a00 = (byte *)(ulong)uVar18;
            uVar15 = uVar18;
            goto LAB_00145f2e;
          }
          uVar18 = uVar18 + 1;
          iVar3 = iVar3 + -1;
        } while (2 < iVar3);
      }
      goto LAB_00145f2c;
    }
LAB_00145e95:
    lVar13 = 1;
    local_1a00 = (byte *)(ulong)uVar15;
    goto LAB_00145f2e;
  case 9:
    local_19b8 = 0;
    uStack_19b0 = 0;
    local_19c8 = (byte *)0x25;
    uStack_19c0 = 0;
    sVar7 = strlen((char *)&local_19c8);
    if ((uVar16 >> 0xd & 1) != 0) {
      uVar29 = (ulong)local_1038[uVar30 * 8];
    }
    iVar3 = (int)uVar29;
    if ((short)uVar16 < 0) {
      uVar18 = local_1038[uVar30 * 8 + 1];
    }
    pbVar33 = (byte *)((long)&local_19c8 + 1);
    if ((uVar16 & 4) != 0) {
      local_19c8._0_2_ = CONCAT11(0x2d,(char)local_19c8);
      pbVar33 = (byte *)((long)&local_19c8 + 2);
    }
    if ((uVar16 & 2) != 0) {
      *pbVar33 = 0x2b;
      pbVar33 = pbVar33 + 1;
    }
    if ((uVar16 & 1) != 0) {
      *pbVar33 = 0x20;
      pbVar33 = pbVar33 + 1;
    }
    if ((uVar16 & 8) != 0) {
      *pbVar33 = 0x23;
      pbVar33 = pbVar33 + 1;
    }
    maxlength = 0x20 - sVar7;
    *pbVar33 = 0;
    if (-1 < iVar3) {
      if (0x144 < iVar3) {
        uVar29 = 0x145;
      }
      iVar3 = (int)uVar29;
      iVar4 = curl_msnprintf((char *)pbVar33,maxlength,"%d",uVar29);
      pbVar33 = pbVar33 + iVar4;
      maxlength = maxlength - (long)iVar4;
    }
    if (-1 < (int)uVar18) {
      dVar10 = local_1830[uVar27 * 2];
      if (0x145 < (int)uVar18) {
        uVar18 = 0x144;
      }
      iVar4 = 0x145 - iVar3;
      if (iVar3 < (int)uVar18) {
        iVar4 = 0x145;
      }
      if (iVar3 < 1) {
        iVar4 = 0x145;
      }
      for (; 10.0 <= dVar10; dVar10 = dVar10 / 10.0) {
        iVar4 = iVar4 + -1;
      }
      uVar19 = iVar4 - 1;
      if ((int)uVar18 <= iVar4) {
        uVar19 = uVar18;
      }
      if ((int)uVar19 < 1) {
        uVar19 = 0;
      }
      iVar3 = curl_msnprintf((char *)pbVar33,maxlength,".%d",(ulong)uVar19);
      pbVar33 = pbVar33 + iVar3;
    }
    if ((uVar16 & 0x20) != 0) {
      *pbVar33 = 0x6c;
      pbVar33 = pbVar33 + 1;
    }
    if ((uVar16 >> 0x12 & 1) == 0) {
      bVar1 = 0x66;
      if ((uVar16 >> 0x13 & 1) != 0) {
        bVar1 = ((uVar16 >> 0xc & 1) == 0) << 5 | 0x47;
      }
    }
    else {
      bVar1 = ((uVar16 >> 0xc & 1) == 0) << 5 | 0x45;
    }
    *pbVar33 = bVar1;
    pbVar33[1] = 0;
    snprintf((char *)&local_1988,0x146,(char *)&local_19c8,SUB84(local_1830[uVar27 * 2],0));
    lVar13 = 10;
    bVar34 = (uchar)local_1988 == '\0';
    if (!bVar34) {
      iVar3 = (*stream)((uchar)local_1988,userp);
      puVar32 = (uchar *)((long)&local_1988 + 1);
      while (iVar3 == 0) {
        uVar15 = uVar15 + 1;
        bVar34 = *puVar32 == '\0';
        if (bVar34) goto joined_r0x00145b9e;
        iVar3 = (*stream)(*puVar32,userp);
        puVar32 = puVar32 + 1;
      }
      lVar13 = 1;
      local_1a00 = (byte *)(ulong)uVar15;
    }
  }
joined_r0x00145b9e:
  uVar19 = uVar15;
  if (bVar34) goto LAB_00145f2c;
  goto LAB_00145f2e;
code_r0x00145ec3:
  uVar2 = "(nil)"[lVar13 + 1];
  lVar13 = lVar13 + 1;
  if (lVar13 == 5) goto code_r0x00145ed1;
  goto LAB_00145eb3;
code_r0x00145ed1:
  bVar34 = true;
  uVar19 = uVar18;
  if (((uVar16 & 4) == 0) && (0 < iVar3)) {
    uVar19 = uVar15 + iVar3 + 5;
    iVar3 = iVar3 + 1;
    do {
      iVar4 = (*stream)(' ',userp);
      bVar34 = iVar4 == 0;
      if (!bVar34) {
        local_1a00 = (byte *)(ulong)uVar18;
        uVar19 = uVar18;
        break;
      }
      uVar18 = uVar18 + 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
LAB_00145f23:
  lVar13 = 1;
  uVar15 = uVar19;
  if (bVar34) {
LAB_00145f2c:
    lVar13 = 0;
    uVar15 = uVar19;
  }
LAB_00145f2e:
  if (lVar13 != 0) {
    return (int)local_1a00;
  }
  uVar30 = uVar30 + 1;
  if (uVar30 == uVar23) {
    return uVar15;
  }
  goto LAB_0014549b;
}

Assistant:

static int formatf(
  void *userp, /* untouched by format(), just sent to the stream() function in
                  the second argument */
  /* function pointer called for each output character */
  int (*stream)(unsigned char, void *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  static const char nilstr[] = "(nil)";
  const char *digits = lower_digits;   /* Base-36 digits for numbers.  */
  int done = 0;   /* number of characters written  */
  int i;
  int ocount = 0; /* number of output segments */
  int icount = 0; /* number of input arguments */

  struct outsegment output[MAX_SEGMENTS];
  struct va_input input[MAX_PARAMETERS];
  char work[BUFFSIZE + 2];

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (FALSE?) warning Coverity gives us
     otherwise */
  char *workend = &work[BUFFSIZE - 2];

  /* Parse the format string */
  if(parsefmt(format, output, input, &ocount, &icount, ap_save))
    return 0;

  for(i = 0; i < ocount; i++) {
    struct outsegment *optr = &output[i];
    struct va_input *iptr;
    bool is_alt;            /* Format spec modifiers.  */
    int width;              /* Width of a field.  */
    int prec;               /* Precision of a field.  */
    bool is_neg;            /* Decimal integer is negative.  */
    unsigned long base;     /* Base of a number to be written.  */
    mp_uintmax_t num;       /* Integral values to be written.  */
    mp_intmax_t signed_num; /* Used to convert negative in positive.  */
    char *w;
    size_t outlen = optr->outlen;
    unsigned int flags = optr->flags;

    if(outlen) {
      const char *str = optr->start;
      for(; outlen && *str; outlen--)
        OUTCHAR(*str++);
      if(optr->flags & FLAGS_SUBSTR)
        /* this is just a substring */
        continue;
    }

    /* pick up the specified width */
    if(flags & FLAGS_WIDTHPARAM) {
      width = (int)input[optr->width].val.nums;
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        if(width == INT_MIN)
          width = INT_MAX;
        else
          width = -width;
        flags |= FLAGS_LEFT;
        flags &= ~(unsigned int)FLAGS_PAD_NIL;
      }
    }
    else
      width = optr->width;

    /* pick up the specified precision */
    if(flags & FLAGS_PRECPARAM) {
      prec = (int)input[optr->precision].val.nums;
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(flags & FLAGS_PREC)
      prec = optr->precision;
    else
      prec = -1;

    is_alt = (flags & FLAGS_ALT) ? 1 : 0;
    iptr = &input[optr->input];

    switch(iptr->type) {
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      flags |= FLAGS_UNSIGNED;
      FALLTHROUGH();
    case FORMAT_INT:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
      num = iptr->val.numu;
      if(flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(flags & FLAGS_OCTAL) {
        /* Octal unsigned integer */
        base = 8;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer */
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        base = 16;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer */
        base = 10;
        is_neg = FALSE;
      }
      else {
        /* Decimal integer.  */
        base = 10;

        is_neg = (iptr->val.nums < (mp_intmax_t)0);
        if(is_neg) {
          /* signed_num might fail to hold absolute negative minimum by 1 */
          signed_num = iptr->val.nums + (mp_intmax_t)1;
          signed_num = -signed_num;
          num = (mp_uintmax_t)signed_num;
          num += (mp_uintmax_t)1;
        }
      }
number:
      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      switch(base) {
      case 10:
        while(num > 0) {
          *w-- = (char)('0' + (num % 10));
          num /= 10;
        }
        break;
      default:
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        break;
      }
      width -= (int)(workend - w);
      prec -= (int)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (flags & FLAGS_SHOWSIGN) || (flags & FLAGS_SPACE))
        --width;

      if(!(flags & FLAGS_LEFT) && !(flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(flags & FLAGS_LEFT) && (flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING: {
      const char *str;
      size_t len;

      str = iptr->val.str;
      if(!str) {
        /* Write null string if there is space.  */
        if(prec == -1 || prec >= (int) sizeof(nilstr) - 1) {
          str = nilstr;
          len = sizeof(nilstr) - 1;
          /* Disable quotes around (nil) */
          flags &= ~(unsigned int)FLAGS_ALT;
        }
        else {
          str = "";
          len = 0;
        }
      }
      else if(prec != -1)
        len = (size_t)prec;
      else if(*str == '\0')
        len = 0;
      else
        len = strlen(str);

      width -= (len > INT_MAX) ? INT_MAX : (int)len;

      if(flags & FLAGS_ALT)
        OUTCHAR('"');

      if(!(flags & FLAGS_LEFT))
        while(width-- > 0)
          OUTCHAR(' ');

      for(; len && *str; len--)
        OUTCHAR(*str++);
      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');

      if(flags & FLAGS_ALT)
        OUTCHAR('"');
      break;
    }

    case FORMAT_PTR:
      /* Generic pointer.  */
      if(iptr->val.ptr) {
        /* If the pointer is not NULL, write it as a %#x spec.  */
        base = 16;
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        is_alt = TRUE;
        num = (size_t) iptr->val.ptr;
        is_neg = FALSE;
        goto number;
      }
      else {
        /* Write "(nil)" for a nil pointer.  */
        const char *point;

        width -= (int)(sizeof(nilstr) - 1);
        if(flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
        for(point = nilstr; *point != '\0'; ++point)
          OUTCHAR(*point);
        if(!(flags & FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_DOUBLE: {
      char formatbuf[32]="%";
      char *fptr = &formatbuf[1];
      size_t left = sizeof(formatbuf)-strlen(formatbuf);
      int len;

      if(flags & FLAGS_WIDTH)
        width = optr->width;

      if(flags & FLAGS_PREC)
        prec = optr->precision;

      if(flags & FLAGS_LEFT)
        *fptr++ = '-';
      if(flags & FLAGS_SHOWSIGN)
        *fptr++ = '+';
      if(flags & FLAGS_SPACE)
        *fptr++ = ' ';
      if(flags & FLAGS_ALT)
        *fptr++ = '#';

      *fptr = 0;

      if(width >= 0) {
        size_t dlen;
        if(width >= BUFFSIZE)
          width = BUFFSIZE - 1;
        /* RECURSIVE USAGE */
        dlen = (size_t)curl_msnprintf(fptr, left, "%d", width);
        fptr += dlen;
        left -= dlen;
      }
      if(prec >= 0) {
        /* for each digit in the integer part, we can have one less
           precision */
        int maxprec = BUFFSIZE - 1;
        double val = iptr->val.dnum;
        if(prec > maxprec)
          prec = maxprec - 1;
        if(width > 0 && prec <= width)
          maxprec -= width;
        while(val >= 10.0) {
          val /= 10;
          maxprec--;
        }

        if(prec > maxprec)
          prec = maxprec - 1;
        if(prec < 0)
          prec = 0;
        /* RECURSIVE USAGE */
        len = curl_msnprintf(fptr, left, ".%d", prec);
        fptr += len;
      }
      if(flags & FLAGS_LONG)
        *fptr++ = 'l';

      if(flags & FLAGS_FLOATE)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'E' : 'e');
      else if(flags & FLAGS_FLOATG)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'G' : 'g');
      else
        *fptr++ = 'f';

      *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
      /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
         output characters */
#ifdef HAVE_SNPRINTF
      /* !checksrc! disable LONGLINE */
      /* NOLINTNEXTLINE(clang-analyzer-security.insecureAPI.DeprecatedOrUnsafeBufferHandling) */
      (snprintf)(work, BUFFSIZE, formatbuf, iptr->val.dnum);
#ifdef _WIN32
      /* Old versions of the Windows CRT do not terminate the snprintf output
         buffer if it reaches the max size so we do that here. */
      work[BUFFSIZE - 1] = 0;
#endif
#else
      (sprintf)(work, formatbuf, iptr->val.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
      DEBUGASSERT(strlen(work) < BUFFSIZE);
      for(fptr = work; *fptr; fptr++)
        OUTCHAR(*fptr);
      break;
    }

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) iptr->val.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(flags & FLAGS_LONG)
          *(long *) iptr->val.ptr = (long)done;
      else if(!(flags & FLAGS_SHORT))
        *(int *) iptr->val.ptr = (int)done;
      else
        *(short *) iptr->val.ptr = (short)done;
      break;

    default:
      break;
    }
  }
  return done;
}